

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-digits.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  FILE *input;
  undefined1 local_28 [4];
  int i;
  Settings set;
  char **argv_local;
  int argc_local;
  
  name = *argv;
  local_28 = (undefined1  [4])0x0;
  set._0_8_ = _stdout;
  set.output = (FILE *)argv;
  input._4_4_ = handle_arguments(argc,argv,(Settings *)local_28);
  if (input._4_4_ == argc) {
    handle_file(_stdin,(Settings *)local_28);
  }
  for (; input._4_4_ < argc; input._4_4_ = input._4_4_ + 1) {
    __stream = fopen(*(char **)(&(set.output)->_flags + (long)input._4_4_ * 2),"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR:\t",name);
      fprintf(_stderr,"couldn\'t open file %s",
              *(undefined8 *)(&(set.output)->_flags + (long)input._4_4_ * 2));
      fprintf(_stderr,"\n");
    }
    else {
      handle_file((FILE *)__stream,(Settings *)local_28);
      fclose(__stream);
    }
  }
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
    name = argv[0];

    Settings set = {0, stdout};
    int i = handle_arguments(argc, argv, &set);

    if (i == argc)
    {
        handle_file(stdin, &set);
    }
    for (; i < argc; i++)
    {
        FILE *input = fopen(argv[i], "r");
        if (input == NULL)
        {
            ERROR_MSG("couldn't open file %s", argv[i]);
            continue;
        }
        handle_file(input, &set);
        fclose(input);
    }

    exit(EXIT_SUCCESS);
}